

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

bool __thiscall QCss::Parser::parseExpr(Parser *this,QList<QCss::Value> *values)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  Value val;
  anon_union_24_3_e3d07ef4_for_data local_88;
  undefined8 local_70;
  Value local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._0_8_ = 0xaaaaaaaa00000000;
  local_68.variant.d.data.shared = (PrivateShared *)0x0;
  local_68.variant.d.data._8_8_ = 0;
  local_68.variant.d.data._16_8_ = 0;
  local_68.variant.d._24_8_ = 2;
  bVar1 = parseTerm(this,&local_68);
  bVar3 = false;
  if (bVar1) {
    QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
              ((QMovableArrayOps<QCss::Value> *)values,(values->d).size,&local_68);
    QList<QCss::Value>::end(values);
    do {
      local_88.shared = (PrivateShared *)0x0;
      local_88._8_8_ = 0;
      local_88._16_8_ = 0;
      local_70 = 2;
      local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
      ::QVariant::operator=(&local_68.variant,(QVariant *)&local_88);
      ::QVariant::~QVariant((QVariant *)&local_88);
      parseNextOperator(this,&local_68);
      if (local_68.type != Unknown) {
        QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
                  ((QMovableArrayOps<QCss::Value> *)values,(values->d).size,&local_68);
        QList<QCss::Value>::end(values);
      }
      bVar1 = testTerm(this);
      bVar3 = true;
      if (!bVar1) break;
      local_88.shared = (PrivateShared *)0x0;
      local_88._8_8_ = 0;
      local_88._16_8_ = 0;
      local_70 = 2;
      local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
      ::QVariant::operator=(&local_68.variant,(QVariant *)&local_88);
      ::QVariant::~QVariant((QVariant *)&local_88);
      bVar2 = parseTerm(this,&local_68);
      if (!bVar2) {
        bVar3 = false;
        break;
      }
      QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
                ((QMovableArrayOps<QCss::Value> *)values,(values->d).size,&local_68);
      QList<QCss::Value>::end(values);
    } while (bVar1);
  }
  ::QVariant::~QVariant(&local_68.variant);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool Parser::parseExpr(QList<Value> *values)
{
    Value val;
    if (!parseTerm(&val)) return false;
    values->append(val);
    bool onceMore;
    do {
        onceMore = false;
        val = Value();
        if (!parseNextOperator(&val)) return false;
        if (val.type != QCss::Value::Unknown)
            values->append(val);
        if (testTerm()) {
            onceMore = true;
            val = Value();
            if (!parseTerm(&val)) return false;
            values->append(val);
        }
    } while (onceMore);
    return true;
}